

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O1

jboolean Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1maxent_1get
                   (JNIEnv *jenv,jclass jcls,jlong jarg1,jobject jarg1_)

{
  return *(jboolean *)(jarg1 + 0x18);
}

Assistant:

SWIGEXPORT jboolean JNICALL Java_fr_limsi_wapiti_WapitiJNI_opt_1s_1maxent_1get(JNIEnv *jenv, jclass jcls, jlong jarg1, jobject jarg1_) {
  jboolean jresult = 0 ;
  opt_s *arg1 = (opt_s *) 0 ;
  bool result;
  
  (void)jenv;
  (void)jcls;
  (void)jarg1_;
  arg1 = *(opt_s **)&jarg1; 
  result = (bool) ((arg1)->maxent);
  jresult = (jboolean)result; 
  return jresult;
}